

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O0

string * __thiscall
IfNeuron::getParameter(string *__return_storage_ptr__,IfNeuron *this,string *name)

{
  bool bVar1;
  allocator<char> local_261;
  string local_260;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream param;
  ostream local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *name_local;
  IfNeuron *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (IfNeuron *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = std::operator==(local_20,"threshold");
  if (bVar1) {
    std::ostream::operator<<(&local_198,this->ifneuronTheta);
  }
  else {
    bVar1 = std::operator==(local_20,"spike-height");
    if (bVar1) {
      std::ostream::operator<<(&local_198,this->ifneuronSpikeHeight);
    }
    else {
      bVar1 = std::operator==(local_20,"membrane starting-value");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"starting-value",&local_1f9);
        DifferentialEquation::getParameter(&local_1d8,&this->ifneuronMembrane,&local_1f8);
        std::operator<<(&local_198,(string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
      }
      else {
        bVar1 = std::operator==(local_20,"membrane");
        if (bVar1) {
          Parametric::getConfiguration_abi_cxx11_(&local_220,(Parametric *)&this->ifneuronMembrane);
          std::operator<<(&local_198,(string *)&local_220);
          std::__cxx11::string::~string((string *)&local_220);
        }
        else {
          bVar1 = std::operator==(local_20,"membrane integration-mode");
          if (!bVar1) {
            Parametric::getParameter
                      (__return_storage_ptr__,
                       (Parametric *)&(this->super_SpikingNeuron).super_StochasticEventGenerator,
                       local_20);
            goto LAB_00156bc0;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"mode",&local_261)
          ;
          DifferentialEquation::getParameter(&local_240,&this->ifneuronMembrane,&local_260);
          std::operator<<(&local_198,(string *)&local_240);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_260);
          std::allocator<char>::~allocator(&local_261);
        }
      }
    }
  }
  std::__cxx11::stringstream::str();
LAB_00156bc0:
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string IfNeuron::getParameter(const string& name) const
{
	stringstream param;
	if (name == "threshold")
		param << ifneuronTheta;
	else if (name=="spike-height")
		param << ifneuronSpikeHeight;
	else if (name== "membrane starting-value")
		param << ifneuronMembrane.getParameter("starting-value");
	else if (name=="membrane")
		param << ifneuronMembrane.getConfiguration();
	else if (name=="membrane integration-mode")
		param << ifneuronMembrane.getParameter("mode");
	else
		return SpikingNeuron::getParameter(name);
		
	return param.str();
}